

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixCheckReservedLock(sqlite3_file *id,int *pResOut)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  flock lock;
  
  unixEnterMutex();
  if (*(byte *)((long)&(id[2].pMethods)->xRead + 4) < 2) {
    iVar4 = 0;
    iVar3 = 0;
    if (*(char *)((long)&(id[2].pMethods)->xRead + 5) == '\0') {
      iVar4 = 0;
      iVar1 = (*aSyscall[7].pCurrent)((ulong)*(uint *)&id[3].pMethods,5);
      if (iVar1 == 0) {
        iVar4 = 1;
      }
      else {
        piVar2 = __errno_location();
        *(int *)&id[4].pMethods = *piVar2;
        iVar3 = 0xe0a;
      }
    }
  }
  else {
    iVar3 = 0;
    iVar4 = 1;
  }
  unixLeaveMutex();
  *pResOut = iVar4;
  return iVar3;
}

Assistant:

static int unixCheckReservedLock(sqlite3_file *id, int *pResOut){
  int rc = SQLITE_OK;
  int reserved = 0;
  unixFile *pFile = (unixFile*)id;

  SimulateIOError( return SQLITE_IOERR_CHECKRESERVEDLOCK; );

  assert( pFile );
  unixEnterMutex(); /* Because pFile->pInode is shared across threads */

  /* Check if a thread in this process holds such a lock */
  if( pFile->pInode->eFileLock>SHARED_LOCK ){
    reserved = 1;
  }

  /* Otherwise see if some other process holds it.
  */
#ifndef __DJGPP__
  if( !reserved && !pFile->pInode->bProcessLock ){
    struct flock lock;
    lock.l_whence = SEEK_SET;
    lock.l_start = RESERVED_BYTE;
    lock.l_len = 1;
    lock.l_type = F_WRLCK;
    if( osFcntl(pFile->h, F_GETLK, &lock) ){
      rc = SQLITE_IOERR_CHECKRESERVEDLOCK;
      pFile->lastErrno = errno;
    } else if( lock.l_type!=F_UNLCK ){
      reserved = 1;
    }
  }
#endif
  
  unixLeaveMutex();
  OSTRACE(("TEST WR-LOCK %d %d %d (unix)\n", pFile->h, rc, reserved));

  *pResOut = reserved;
  return rc;
}